

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::log_assert(ConsoleReporter *this,AssertData *rb)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> DOCTEST_ANON_LOCK_10;
  AssertData *rb_local;
  ConsoleReporter *this_local;
  
  if ((((rb->m_failed & 1U) != 0) || ((this->opt->success & 1U) != 0)) &&
     ((this->tc->m_no_output & 1U) == 0)) {
    DOCTEST_ANON_LOCK_10._M_device = (mutex_type *)rb;
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
    logTestStart(this);
    (*(this->super_IReporter)._vptr_IReporter[0xe])
              (this,*(undefined8 *)
                     ((long)&((DOCTEST_ANON_LOCK_10._M_device)->super___mutex_base)._M_mutex + 0x10)
               ,(ulong)*(uint *)((long)&((DOCTEST_ANON_LOCK_10._M_device)->super___mutex_base).
                                        _M_mutex + 0x18)," ");
    successOrFailColoredStringToStream
              (this,(bool)(~DOCTEST_ANON_LOCK_10._M_device[1].super___mutex_base._M_mutex.__size[0]
                          & 1),
               ((DOCTEST_ANON_LOCK_10._M_device)->super___mutex_base)._M_mutex.__data.__owner,
               "SUCCESS");
    fulltext_log_assert_to_stream(this->s,(AssertData *)DOCTEST_ANON_LOCK_10._M_device);
    log_contexts(this);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if((!rb.m_failed && !opt.success) || tc->m_no_output)
                return;

            DOCTEST_LOCK_MUTEX(mutex)

            logTestStart();

            file_line_to_stream(rb.m_file, rb.m_line, " ");
            successOrFailColoredStringToStream(!rb.m_failed, rb.m_at);

            fulltext_log_assert_to_stream(s, rb);

            log_contexts();
        }